

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::SetLogBacktraceLocation(lts_20250127 *this,string_view file,int line)

{
  uint64_t uVar1;
  ulong uVar2;
  undefined4 in_register_0000000c;
  uint64_t v;
  
  uVar1 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,file._M_len,this,
                     CONCAT44(in_register_0000000c,line));
  uVar2 = (uVar1 ^ (ulong)this) * -0x234dd359734ecb13;
  uVar2 = ((ulong)(uint)file._M_str ^
          (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38)) * -0x234dd359734ecb13;
  _ZN4absl12lts_2025012712_GLOBAL__N_121log_backtrace_at_hashE_0 =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  return;
}

Assistant:

void SetLogBacktraceLocation(absl::string_view file, int line) {
  log_backtrace_at_hash.store(HashSiteForLogBacktraceAt(file, line),
                              std::memory_order_relaxed);
}